

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  undefined8 sectionNode;
  byte bVar1;
  bool testOkToFail;
  size_type sVar2;
  __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  ulong uVar3;
  element_type *peVar4;
  allocator<char> local_119;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [48];
  string local_68;
  undefined1 local_48 [8];
  string className;
  SectionNode *rootSection;
  TestCaseStats *stats;
  TestCaseNode *testCaseNode_local;
  JunitReporter *this_local;
  
  sVar2 = clara::std::
          vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
          ::size(&testCaseNode->children);
  if (sVar2 != 1) {
    __assert_fail("testCaseNode.children.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/catch/include/catch/catch.hpp"
                  ,0x423b,"void Catch::JunitReporter::writeTestCase(const TestCaseNode &)");
  }
  this_00 = (__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)clara::std::
               vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
               ::front(&testCaseNode->children);
  className.field_2._8_8_ =
       clara::std::
       __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator*(this_00);
  std::__cxx11::string::string
            ((string *)local_48,(string *)&(testCaseNode->value).testInfo.className);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    anon_unknown_1::fileNameTag(&local_68,&(testCaseNode->value).testInfo.tags);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_48,"global");
    }
  }
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config);
  (*(peVar4->super_NonCopyable)._vptr_NonCopyable[4])(local_98);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_98);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    peVar4 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config);
    (*(peVar4->super_NonCopyable)._vptr_NonCopyable[4])(&local_f8);
    std::operator+(&local_d8,&local_f8,".");
    std::operator+(&local_b8,&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
  sectionNode = className.field_2._8_8_;
  testOkToFail = TestCaseInfo::okToFail(&(testCaseNode->value).testInfo);
  writeSection(this,(string *)local_48,&local_118,(SectionNode *)sectionNode,testOkToFail);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void JunitReporter::writeTestCase( TestCaseNode const& testCaseNode ) {
        TestCaseStats const& stats = testCaseNode.value;

        // All test cases have exactly one section - which represents the
        // test case itself. That section may have 0-n nested sections
        assert( testCaseNode.children.size() == 1 );
        SectionNode const& rootSection = *testCaseNode.children.front();

        std::string className = stats.testInfo.className;

        if( className.empty() ) {
            className = fileNameTag(stats.testInfo.tags);
            if ( className.empty() )
                className = "global";
        }

        if ( !m_config->name().empty() )
            className = m_config->name() + "." + className;

        writeSection( className, "", rootSection, stats.testInfo.okToFail() );
    }